

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdn.c
# Opt level: O2

char * Qiniu_CDN_CreateTimestampAntiLeechURL
                 (char *host,char *fileName,char *queryStr,Qiniu_Uint64 deadline,char *cryptKey)

{
  char *s2;
  char *addr;
  char *addr_00;
  char *src;
  char *addr_01;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  Qiniu_Bool queryStrEscapeOk;
  Qiniu_Bool fileNameEscapeOk;
  char *local_50;
  char expireHex [20];
  
  fileNameEscapeOk = 0;
  queryStrEscapeOk = 0;
  local_50 = host;
  s2 = Qiniu_PathEscape(fileName,&fileNameEscapeOk);
  addr = (char *)0x0;
  snprintf(expireHex,0x14,"%0llx",deadline);
  if (queryStr != (char *)0x0) {
    if (*queryStr == '\0') {
      addr = (char *)0x0;
    }
    else {
      addr = Qiniu_PathEscape(queryStr,&queryStrEscapeOk);
    }
  }
  addr_00 = Qiniu_String_Concat2("/",s2);
  src = Qiniu_String_Concat(cryptKey,addr_00,expireHex,0);
  addr_01 = Qiniu_MD5_HexStr(src);
  if (addr == (char *)0x0) {
    pcVar5 = (char *)0x0;
    pcVar3 = "?sign=";
    pcVar4 = "&t=";
    pcVar1 = expireHex;
    pcVar2 = addr_01;
  }
  else {
    pcVar5 = "&t=";
    pcVar3 = "?";
    pcVar4 = "&sign=";
    pcVar2 = addr;
    pcVar1 = addr_01;
  }
  pcVar1 = Qiniu_String_Concat(local_50,addr_00,pcVar3,pcVar2,pcVar4,pcVar1,pcVar5);
  if (fileNameEscapeOk == 1) {
    Qiniu_Free(s2);
  }
  if (queryStrEscapeOk == 1) {
    Qiniu_Free(addr);
  }
  Qiniu_Free(addr_00);
  Qiniu_Free(src);
  Qiniu_Free(addr_01);
  return pcVar1;
}

Assistant:

char *Qiniu_CDN_CreateTimestampAntiLeechURL(const char *host, const char *fileName, char *queryStr,
                                            Qiniu_Uint64 deadline, const char *cryptKey) {
    char *finalURL = NULL;
    Qiniu_Bool fileNameEscapeOk = Qiniu_False;
    Qiniu_Bool queryStrEscapeOk = Qiniu_False;
    char *fileNameEscaped = Qiniu_PathEscape(fileName, &fileNameEscapeOk);
    char *queryStrEscaped = NULL;

    char expireHex[20];
    snprintf(expireHex, 20, "%0llx", deadline);

    if (queryStr != NULL && strcmp("", queryStr) != 0) {
        queryStrEscaped = Qiniu_PathEscape(queryStr, &queryStrEscapeOk);
    }

    char *path = Qiniu_String_Concat2("/", fileNameEscaped);
    char *signStr = Qiniu_String_Concat(cryptKey, path, expireHex, NULL);
    char *sign = (char *) Qiniu_MD5_HexStr(signStr);

    if (queryStrEscaped != NULL) {
        finalURL = Qiniu_String_Concat(host, path, "?", queryStrEscaped, "&sign=", sign, "&t=", expireHex, NULL);
    } else {
        finalURL = Qiniu_String_Concat(host, path, "?sign=", sign, "&t=", expireHex, NULL);
    }

    if (fileNameEscapeOk == Qiniu_True) {
        Qiniu_Free(fileNameEscaped);
    }
    if (queryStrEscapeOk == Qiniu_True) {
        Qiniu_Free(queryStrEscaped);
    }
    Qiniu_Free(path);
    Qiniu_Free(signStr);
    Qiniu_Free(sign);
    return finalURL;
}